

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewWidget.cpp
# Opt level: O2

void __thiscall KDReports::PreviewWidgetPrivate::fillZoomCombo(PreviewWidgetPrivate *this)

{
  double dVar1;
  QComboBox *pQVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QVariant local_50;
  
  QComboBox::clear();
  bVar4 = false;
  for (lVar5 = 0; lVar5 != 0x58; lVar5 = lVar5 + 8) {
    dVar1 = *(double *)((long)fillZoomCombo::s_zoomFactors + lVar5);
    bVar3 = !bVar4;
    bVar4 = true;
    if (bVar3) {
      if (this->m_zoomFactor <= dVar1 + -0.001) {
        pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
        QString::number(this->m_zoomFactor * 100.0,(char)&local_80,0x67);
        operator+((QString *)&local_68,(QString *)&local_80,(QChar)0x25);
        QVariant::QVariant(&local_50,dVar1);
        QComboBox::addItem(pQVar2,(QString *)&local_68,&local_50);
        QVariant::~QVariant(&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
        QComboBox::count();
        QComboBox::setCurrentIndex((int)pQVar2);
      }
      else {
        bVar4 = false;
      }
    }
    pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
    QString::number(dVar1 * 100.0,(char)&local_80,0x67);
    operator+((QString *)&local_68,(QString *)&local_80,(QChar)0x25);
    QVariant::QVariant(&local_50,dVar1);
    QComboBox::addItem(pQVar2,(QString *)&local_68,&local_50);
    QVariant::~QVariant(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if ((dVar1 + -0.001 < this->m_zoomFactor) && (this->m_zoomFactor < dVar1 + 0.001)) {
      pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
      QComboBox::count();
      QComboBox::setCurrentIndex((int)pQVar2);
      bVar4 = true;
    }
  }
  return;
}

Assistant:

void KDReports::PreviewWidgetPrivate::fillZoomCombo()
{
    static const double s_zoomFactors[] = {0.125, 0.25, 0.333, 0.5, 0.667, 0.75, 1, 1.25, 1.50, 2, 4};

    zoomCombo->clear();
    bool currentZoomFound = false;
    for (const qreal val : s_zoomFactors) {
        if (!currentZoomFound && m_zoomFactor <= val - 0.001) {
            zoomCombo->addItem(QString::number(m_zoomFactor * 100) + QChar::fromLatin1('%'), QVariant(val));
            zoomCombo->setCurrentIndex(zoomCombo->count() - 1);
            currentZoomFound = true;
        }
        zoomCombo->addItem(QString::number(val * 100) + QChar::fromLatin1('%'), QVariant(val));
        if (m_zoomFactor > val - 0.001 && m_zoomFactor < val + 0.001) {
            zoomCombo->setCurrentIndex(zoomCombo->count() - 1);
            currentZoomFound = true;
        }
    }
}